

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.cpp
# Opt level: O0

void __thiscall CCharacterCore::Read(CCharacterCore *this,CNetObj_CharacterCore *pObjCore)

{
  CNetObj_CharacterCore *pObjCore_local;
  CCharacterCore *this_local;
  
  (this->m_Pos).field_0.x = (float)pObjCore->m_X;
  (this->m_Pos).field_1.y = (float)pObjCore->m_Y;
  (this->m_Vel).field_0.x = (float)pObjCore->m_VelX / 256.0;
  (this->m_Vel).field_1.y = (float)pObjCore->m_VelY / 256.0;
  this->m_HookState = pObjCore->m_HookState;
  this->m_HookTick = pObjCore->m_HookTick;
  (this->m_HookPos).field_0.x = (float)pObjCore->m_HookX;
  (this->m_HookPos).field_1.y = (float)pObjCore->m_HookY;
  (this->m_HookDir).field_0.x = (float)pObjCore->m_HookDx / 256.0;
  (this->m_HookDir).field_1.y = (float)pObjCore->m_HookDy / 256.0;
  this->m_HookedPlayer = pObjCore->m_HookedPlayer;
  this->m_Jumped = pObjCore->m_Jumped;
  this->m_Direction = pObjCore->m_Direction;
  this->m_Angle = pObjCore->m_Angle;
  return;
}

Assistant:

void CCharacterCore::Read(const CNetObj_CharacterCore *pObjCore)
{
	m_Pos.x = pObjCore->m_X;
	m_Pos.y = pObjCore->m_Y;
	m_Vel.x = pObjCore->m_VelX/256.0f;
	m_Vel.y = pObjCore->m_VelY/256.0f;
	m_HookState = pObjCore->m_HookState;
	m_HookTick = pObjCore->m_HookTick;
	m_HookPos.x = pObjCore->m_HookX;
	m_HookPos.y = pObjCore->m_HookY;
	m_HookDir.x = pObjCore->m_HookDx/256.0f;
	m_HookDir.y = pObjCore->m_HookDy/256.0f;
	m_HookedPlayer = pObjCore->m_HookedPlayer;
	m_Jumped = pObjCore->m_Jumped;
	m_Direction = pObjCore->m_Direction;
	m_Angle = pObjCore->m_Angle;
}